

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_hmac_sha256(void)

{
  int iVar1;
  ptls_cipher_suite_t *ppVar2;
  ptls_hash_context_t *ppVar3;
  uint8_t digest [32];
  
  ppVar2 = find_cipher(ctx,0x1301);
  ppVar3 = ptls_hmac_create(ppVar2->hash,"\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v",0x14);
  digest[0] = '\0';
  digest[1] = '\0';
  digest[2] = '\0';
  digest[3] = '\0';
  digest[4] = '\0';
  digest[5] = '\0';
  digest[6] = '\0';
  digest[7] = '\0';
  digest[8] = '\0';
  digest[9] = '\0';
  digest[10] = '\0';
  digest[0xb] = '\0';
  digest[0xc] = '\0';
  digest[0xd] = '\0';
  digest[0xe] = '\0';
  digest[0xf] = '\0';
  digest[0x10] = '\0';
  digest[0x11] = '\0';
  digest[0x12] = '\0';
  digest[0x13] = '\0';
  digest[0x14] = '\0';
  digest[0x15] = '\0';
  digest[0x16] = '\0';
  digest[0x17] = '\0';
  digest[0x18] = '\0';
  digest[0x19] = '\0';
  digest[0x1a] = '\0';
  digest[0x1b] = '\0';
  digest[0x1c] = '\0';
  digest[0x1d] = '\0';
  digest[0x1e] = '\0';
  digest[0x1f] = '\0';
  (*ppVar3->update)(ppVar3,"Hi There",8);
  (*ppVar3->final)(ppVar3,digest,PTLS_HASH_FINAL_MODE_RESET);
  iVar1 = bcmp(digest,anon_var_dwarf_1266f,0x20);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5f);
  digest[0x10] = '\0';
  digest[0x11] = '\0';
  digest[0x12] = '\0';
  digest[0x13] = '\0';
  digest[0x14] = '\0';
  digest[0x15] = '\0';
  digest[0x16] = '\0';
  digest[0x17] = '\0';
  digest[0x18] = '\0';
  digest[0x19] = '\0';
  digest[0x1a] = '\0';
  digest[0x1b] = '\0';
  digest[0x1c] = '\0';
  digest[0x1d] = '\0';
  digest[0x1e] = '\0';
  digest[0x1f] = '\0';
  digest[0] = '\0';
  digest[1] = '\0';
  digest[2] = '\0';
  digest[3] = '\0';
  digest[4] = '\0';
  digest[5] = '\0';
  digest[6] = '\0';
  digest[7] = '\0';
  digest[8] = '\0';
  digest[9] = '\0';
  digest[10] = '\0';
  digest[0xb] = '\0';
  digest[0xc] = '\0';
  digest[0xd] = '\0';
  digest[0xe] = '\0';
  digest[0xf] = '\0';
  (*ppVar3->update)(ppVar3,"Hi There",8);
  (*ppVar3->final)(ppVar3,digest,PTLS_HASH_FINAL_MODE_RESET);
  iVar1 = bcmp(digest,anon_var_dwarf_1266f,0x20);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",100);
  digest[0x10] = '\0';
  digest[0x11] = '\0';
  digest[0x12] = '\0';
  digest[0x13] = '\0';
  digest[0x14] = '\0';
  digest[0x15] = '\0';
  digest[0x16] = '\0';
  digest[0x17] = '\0';
  digest[0x18] = '\0';
  digest[0x19] = '\0';
  digest[0x1a] = '\0';
  digest[0x1b] = '\0';
  digest[0x1c] = '\0';
  digest[0x1d] = '\0';
  digest[0x1e] = '\0';
  digest[0x1f] = '\0';
  digest[0] = '\0';
  digest[1] = '\0';
  digest[2] = '\0';
  digest[3] = '\0';
  digest[4] = '\0';
  digest[5] = '\0';
  digest[6] = '\0';
  digest[7] = '\0';
  digest[8] = '\0';
  digest[9] = '\0';
  digest[10] = '\0';
  digest[0xb] = '\0';
  digest[0xc] = '\0';
  digest[0xd] = '\0';
  digest[0xe] = '\0';
  digest[0xf] = '\0';
  (*ppVar3->update)(ppVar3,"Hi There",8);
  (*ppVar3->final)(ppVar3,digest,PTLS_HASH_FINAL_MODE_FREE);
  iVar1 = bcmp(digest,anon_var_dwarf_1266f,0x20);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x69);
  return;
}

Assistant:

static void test_hmac_sha256(void)
{
    /* test vector from RFC 4231 */
    const char *secret = "\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b", *message = "Hi There",
               *expected =
                   "\xb0\x34\x4c\x61\xd8\xdb\x38\x53\x5c\xa8\xaf\xce\xaf\x0b\xf1\x2b\x88\x1d\xc2\x00\xc9\x83\x3d\xa7\x26\xe9\x37"
                   "\x6c\x2e\x32\xcf\xf7";
    uint8_t digest[32];

    ptls_hash_context_t *hctx =
        ptls_hmac_create(find_cipher(ctx, PTLS_CIPHER_SUITE_AES_128_GCM_SHA256)->hash, secret, strlen(secret));

    memset(digest, 0, sizeof(digest));
    hctx->update(hctx, message, strlen(message));
    hctx->final(hctx, digest, PTLS_HASH_FINAL_MODE_RESET);
    ok(memcmp(digest, expected, 32) == 0);

    memset(digest, 0, sizeof(digest));
    hctx->update(hctx, message, strlen(message));
    hctx->final(hctx, digest, PTLS_HASH_FINAL_MODE_RESET);
    ok(memcmp(digest, expected, 32) == 0);

    memset(digest, 0, sizeof(digest));
    hctx->update(hctx, message, strlen(message));
    hctx->final(hctx, digest, PTLS_HASH_FINAL_MODE_FREE);
    ok(memcmp(digest, expected, 32) == 0);
}